

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_safe_queue.h
# Opt level: O1

size_t __thiscall cppnet::ThreadSafeQueue<cppnet::Log_*>::Size(ThreadSafeQueue<cppnet::Log_*> *this)

{
  _Map_pointer pppLVar1;
  _Map_pointer pppLVar2;
  _Elt_pointer ppLVar3;
  _Elt_pointer ppLVar4;
  _Elt_pointer ppLVar5;
  _Elt_pointer ppLVar6;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_28;
  
  local_28._M_owns = false;
  local_28._M_device = &this->_mutex;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  pppLVar1 = (this->_queue).c.super__Deque_base<cppnet::Log_*,_std::allocator<cppnet::Log_*>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node;
  pppLVar2 = (this->_queue).c.super__Deque_base<cppnet::Log_*,_std::allocator<cppnet::Log_*>_>.
             _M_impl.super__Deque_impl_data._M_start._M_node;
  ppLVar3 = (this->_queue).c.super__Deque_base<cppnet::Log_*,_std::allocator<cppnet::Log_*>_>.
            _M_impl.super__Deque_impl_data._M_start._M_last;
  ppLVar4 = (this->_queue).c.super__Deque_base<cppnet::Log_*,_std::allocator<cppnet::Log_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  ppLVar5 = (this->_queue).c.super__Deque_base<cppnet::Log_*,_std::allocator<cppnet::Log_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_first;
  ppLVar6 = (this->_queue).c.super__Deque_base<cppnet::Log_*,_std::allocator<cppnet::Log_*>_>.
            _M_impl.super__Deque_impl_data._M_start._M_cur;
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return ((long)ppLVar3 - (long)ppLVar6 >> 3) + ((long)ppLVar4 - (long)ppLVar5 >> 3) +
         ((((ulong)((long)pppLVar1 - (long)pppLVar2) >> 3) - 1) +
         (ulong)(pppLVar1 == (_Map_pointer)0x0)) * 0x40;
}

Assistant:

size_t Size() {
        std::unique_lock<std::mutex> lock(_mutex);
        return _queue.size();
    }